

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void transfer_file_data(connection *conn)

{
  ssize_t sVar1;
  ulong len;
  size_t __nbytes;
  char buf [8192];
  undefined1 auStack_2008 [8192];
  
  if ((conn->ns_conn->send_iobuf).len < 0x4001) {
    __nbytes = (size_t)(int)conn->cl;
    if (0x1fff < conn->cl) {
      __nbytes = 0x2000;
    }
    sVar1 = read((conn->endpoint).fd,auStack_2008,__nbytes);
    if ((int)(uint)sVar1 < 1) {
      close_local_endpoint(conn);
      return;
    }
    len = (ulong)((uint)sVar1 & 0x7fffffff);
    conn->cl = conn->cl - len;
    ns_out(conn->ns_conn,auStack_2008,len);
    if (conn->cl < 1) {
      close_local_endpoint(conn);
    }
  }
  return;
}

Assistant:

static void transfer_file_data(struct connection *conn) {
  char buf[IOBUF_SIZE];
  int n;

  // If output buffer is too big, don't send anything. Wait until
  // mongoose drains already buffered data to the client.
  if (conn->ns_conn->send_iobuf.len > sizeof(buf) * 2) return;

  // Do not send anyt
  n = read(conn->endpoint.fd, buf, conn->cl < (int64_t) sizeof(buf) ?
           (int) conn->cl : (int) sizeof(buf));

  if (n <= 0) {
    close_local_endpoint(conn);
  } else if (n > 0) {
    conn->cl -= n;
    ns_send(conn->ns_conn, buf, n);
    if (conn->cl <= 0) {
      close_local_endpoint(conn);
    }
  }
}